

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O2

duckdb_state
duckdb_register_aggregate_function_set
          (duckdb_connection connection,duckdb_aggregate_function_set function_set)

{
  LogicalType *type;
  pointer pLVar1;
  bool bVar2;
  duckdb_state dVar3;
  reference pvVar4;
  AggregateFunctionInfo *pAVar5;
  ClientContext *this;
  LogicalType *argument;
  pointer type_00;
  idx_t idx;
  ulong __n;
  Connection *con;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  dVar3 = DuckDBError;
  if (function_set != (duckdb_aggregate_function_set)0x0 && connection != (duckdb_connection)0x0) {
    for (__n = 0; __n < (ulong)((*(long *)(function_set + 0x28) - *(long *)(function_set + 0x20)) /
                               0x130); __n = __n + 1) {
      pvVar4 = duckdb::vector<duckdb::AggregateFunction,_true>::get<true>
                         ((vector<duckdb::AggregateFunction,_true> *)(function_set + 0x20),__n);
      pAVar5 = duckdb::shared_ptr<duckdb::AggregateFunctionInfo,_true>::operator->
                         (&pvVar4->function_info);
      if (((((pvVar4->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
             _M_string_length == 0) || (pAVar5[3]._vptr_AggregateFunctionInfo == (_func_int **)0x0))
          || (pAVar5[4]._vptr_AggregateFunctionInfo == (_func_int **)0x0)) ||
         (pAVar5[5]._vptr_AggregateFunctionInfo == (_func_int **)0x0)) {
        return DuckDBError;
      }
      type = &(pvVar4->super_BaseScalarFunction).return_type;
      bVar2 = duckdb::TypeVisitor::Contains(type,INVALID);
      if (bVar2) {
        return DuckDBError;
      }
      bVar2 = duckdb::TypeVisitor::Contains(type,ANY);
      if (bVar2) {
        return DuckDBError;
      }
      type_00 = (pvVar4->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pLVar1 = *(pointer *)
                ((long)&(pvVar4->super_BaseScalarFunction).super_SimpleFunction.arguments.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data + 8);
      while (type_00 != pLVar1) {
        bVar2 = duckdb::TypeVisitor::Contains(type_00,INVALID);
        type_00 = type_00 + 1;
        if (bVar2) {
          return DuckDBError;
        }
      }
    }
    con = (Connection *)connection;
    this = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->
                     ((shared_ptr<duckdb::ClientContext,_true> *)connection);
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/main/capi/aggregate_function-c.cpp:318:42)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/main/capi/aggregate_function-c.cpp:318:42)>
               ::_M_manager;
    local_50._M_unused._M_object = &con;
    local_50._8_8_ = function_set;
    duckdb::ClientContext::RunFunctionInTransaction(this,(function<void_()> *)&local_50,true);
    std::_Function_base::~_Function_base((_Function_base *)&local_50);
    dVar3 = DuckDBSuccess;
  }
  return dVar3;
}

Assistant:

duckdb_state duckdb_register_aggregate_function_set(duckdb_connection connection,
                                                    duckdb_aggregate_function_set function_set) {
	if (!connection || !function_set) {
		return DuckDBError;
	}
	auto &set = duckdb::GetCAggregateFunctionSet(function_set);
	for (idx_t idx = 0; idx < set.Size(); idx++) {
		auto &aggregate_function = set.GetFunctionReferenceByOffset(idx);
		auto &info = aggregate_function.function_info->Cast<duckdb::CAggregateFunctionInfo>();

		if (aggregate_function.name.empty() || !info.update || !info.combine || !info.finalize) {
			return DuckDBError;
		}
		if (duckdb::TypeVisitor::Contains(aggregate_function.return_type, duckdb::LogicalTypeId::INVALID) ||
		    duckdb::TypeVisitor::Contains(aggregate_function.return_type, duckdb::LogicalTypeId::ANY)) {
			return DuckDBError;
		}
		for (const auto &argument : aggregate_function.arguments) {
			if (duckdb::TypeVisitor::Contains(argument, duckdb::LogicalTypeId::INVALID)) {
				return DuckDBError;
			}
		}
	}

	try {
		auto con = reinterpret_cast<duckdb::Connection *>(connection);
		con->context->RunFunctionInTransaction([&]() {
			auto &catalog = duckdb::Catalog::GetSystemCatalog(*con->context);
			duckdb::CreateAggregateFunctionInfo sf_info(set);
			catalog.CreateFunction(*con->context, sf_info);
		});
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBSuccess;
}